

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitterSystem.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::EmitterSystem::Decode(EmitterSystem *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  allocator<char> local_39;
  KString local_38;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (3 < KVar1) {
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16EmitterName);
    KDataStream::Read(stream,&this->m_ui8Function);
    KDataStream::Read(stream,&this->m_ui8EmitterIDNumber);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
  KException::KException(this_00,&local_38,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void EmitterSystem::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < EMITTER_SYSTEM_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui16EmitterName
           >> m_ui8Function
           >> m_ui8EmitterIDNumber;
}